

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O1

string * __thiscall
libaom_examples::(anonymous_namespace)::format_depth_representation_element_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          pair<libaom_examples::DepthRepresentationElement,_bool> *element)

{
  undefined8 *puVar1;
  _anonymous_namespace_ _Var2;
  bool bVar3;
  double dVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  long *plVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  size_type *psVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  string __str_2;
  string __str_1;
  string __str;
  string __str_3;
  ulong *local_1d0;
  uint local_1c8;
  undefined4 uStack_1c4;
  ulong local_1c0 [2];
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [2];
  ulong *local_190;
  long local_188;
  ulong local_180 [2];
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this[8] == (_anonymous_namespace_)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"absent","");
    return __return_storage_ptr__;
  }
  dVar4 = depth_representation_element_to_double((DepthRepresentationElement *)this);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_50,vsnprintf,0x148,"%f",SUB84(dVar4,0));
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_80 = *puVar10;
    lStack_78 = plVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar10;
    local_90 = (ulong *)*plVar8;
  }
  local_88 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  _Var2 = *this;
  local_190 = local_180;
  std::__cxx11::string::_M_construct((ulong)&local_190,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_190,1,(uint)(byte)_Var2);
  uVar14 = 0xf;
  if (local_90 != &local_80) {
    uVar14 = local_80;
  }
  if (uVar14 < (ulong)(local_188 + local_88)) {
    uVar14 = 0xf;
    if (local_190 != local_180) {
      uVar14 = local_180[0];
    }
    if (uVar14 < (ulong)(local_188 + local_88)) goto LAB_001278dc;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_001278dc:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_190);
  }
  local_130 = &local_120;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar9[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (undefined8 *)*puVar9;
  }
  local_128 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_160 = *puVar10;
    lStack_158 = plVar8[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar10;
    local_170 = (ulong *)*plVar8;
  }
  local_168 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  _Var2 = this[1];
  uVar15 = 1;
  if (9 < (byte)_Var2) {
    uVar15 = 3 - ((byte)_Var2 < 100);
  }
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar15);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b0,uVar15,(uint)(byte)_Var2);
  uVar14 = 0xf;
  if (local_170 != &local_160) {
    uVar14 = local_160;
  }
  if (uVar14 < (ulong)(local_1a8 + local_168)) {
    uVar14 = 0xf;
    if (local_1b0 != local_1a0) {
      uVar14 = local_1a0[0];
    }
    if (uVar14 < (ulong)(local_1a8 + local_168)) goto LAB_00127a35;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_00127a35:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_1b0);
  }
  local_110 = &local_100;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar9[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (undefined8 *)*puVar9;
  }
  local_108 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_140 = *puVar10;
    lStack_138 = plVar8[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar10;
    local_150 = (ulong *)*plVar8;
  }
  local_148 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar15 = *(uint *)(this + 4);
  cVar7 = '\x01';
  if (9 < uVar15) {
    uVar12 = uVar15;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (uVar12 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_00127b5f;
      }
      if (uVar12 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_00127b5f;
      }
      if (uVar12 < 10000) goto LAB_00127b5f;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar3);
    cVar7 = cVar7 + '\x01';
  }
LAB_00127b5f:
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d0,local_1c8,uVar15);
  uVar14 = CONCAT44(uStack_1c4,local_1c8) + local_148;
  uVar13 = 0xf;
  if (local_150 != &local_140) {
    uVar13 = local_140;
  }
  if (uVar13 < uVar14) {
    uVar13 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar13 = local_1c0[0];
    }
    if (uVar13 < uVar14) goto LAB_00127bcc;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00127bcc:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1d0);
  }
  local_f0 = &local_e0;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar9[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (undefined8 *)*puVar9;
  }
  local_e8 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_60 = *puVar10;
    lStack_58 = plVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar10;
    local_70 = (ulong *)*plVar8;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  _Var2 = this[2];
  uVar15 = 1;
  if (9 < (byte)_Var2) {
    uVar15 = 3 - ((byte)_Var2 < 100);
  }
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar15);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,uVar15,(uint)(byte)_Var2);
  uVar14 = 0xf;
  if (local_70 != &local_60) {
    uVar14 = local_60;
  }
  if (uVar14 < (ulong)(local_a8 + local_68)) {
    uVar14 = 0xf;
    if (local_b0 != local_a0) {
      uVar14 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_68) <= uVar14) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
      goto LAB_00127d73;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
LAB_00127d73:
  local_d0 = &local_c0;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar9[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar9;
  }
  local_c8 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar11) {
    lVar5 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_depth_representation_element(
    const std::pair<DepthRepresentationElement, bool> &element) {
  if (!element.second) {
    return "absent";
  } else {
    return std::to_string(
               depth_representation_element_to_double(element.first)) +
           " (sign " + std::to_string(element.first.sign_flag) + " exponent " +
           std::to_string(element.first.exponent) + " mantissa " +
           std::to_string(element.first.mantissa) + " mantissa_len " +
           std::to_string(element.first.mantissa_len) + ")";
  }
}